

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O1

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::__cxx11::string,char[6]>
          (String *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char *op,
          char (*rhs) [6])

{
  ostream *stream;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<std::__cxx11::string>(&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  stream = tlssPush();
  filldata<const_char[6]>::fill(stream,(char (*) [6])op);
  tlssPop();
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }